

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

ColorTracker * __thiscall ColorTracker::getHSV(ColorTracker *this,Mat *imgBGR)

{
  int iVar1;
  ProcessingException *this_00;
  int in_R8D;
  _InputArray local_1a8;
  _InputArray local_190;
  undefined1 local_173;
  undefined1 local_172;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Mat *local_18;
  Mat *imgBGR_local;
  Mat *imgHSV;
  
  local_18 = imgBGR;
  imgBGR_local = (Mat *)this;
  iVar1 = cv::Mat::channels(imgBGR);
  if (iVar1 == 3) {
    local_173 = 0;
    cv::Mat::Mat((Mat *)this);
    cv::_InputArray::_InputArray(&local_190,local_18);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_1a8,(Mat *)this);
    cv::cvtColor((cv *)&local_190,&local_1a8,(_OutputArray *)0x28,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1a8);
    cv::_InputArray::~_InputArray(&local_190);
    return this;
  }
  local_172 = 1;
  this_00 = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_119);
  std::operator+(&local_f8,"in ",&local_118);
  std::operator+(&local_d8,&local_f8,", at Line ");
  std::__cxx11::to_string(&local_150,0x9d);
  std::operator+(&local_b8,&local_d8,&local_150);
  std::operator+(&local_98,&local_b8,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"getHSV",&local_171);
  std::operator+(&local_78,&local_98,&local_170);
  std::operator+(&local_58,&local_78,"(): ");
  std::operator+(&local_38,&local_58,"invalid input: passed image must have 3 channels");
  ProcessingException::ProcessingException(this_00,&local_38);
  local_172 = 0;
  __cxa_throw(this_00,&ProcessingException::typeinfo,ProcessingException::~ProcessingException);
}

Assistant:

Mat ColorTracker::getHSV(const Mat& imgBGR){
    if(imgBGR.channels()!=3){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 3 channels");
    }

    Mat imgHSV;
    cv::cvtColor(imgBGR,imgHSV,cv::COLOR_BGR2HSV);

    return imgHSV;
}